

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiTextBuffer *this;
  byte local_61;
  undefined1 local_60 [8];
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  local_61 = 0;
  if ((context->Initialized & 1U) == 0) {
    local_61 = context->SettingsLoaded ^ 0xff;
  }
  if ((local_61 & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xe57,"void ImGui::Initialize(ImGuiContext *)");
  }
  MemAlloc(0x10);
  this = (ImGuiTextBuffer *)operator_new(0x10);
  ImGuiTextBuffer::ImGuiTextBuffer(this);
  context->LogClipboard = this;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)local_60);
  local_60 = (undefined1  [8])0x24e7fe;
  ini_handler.TypeName._0_4_ = ImHash("Window",0,0);
  ini_handler._8_8_ = SettingsHandlerWindow_ReadOpen;
  ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadLine;
  ini_handler.ReadLineFn = SettingsHandlerWindow_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_front(&context->SettingsHandlers,(value_type *)local_60);
  context->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);
    g.LogClipboard = IM_NEW(ImGuiTextBuffer)();

    // Add .ini handle for ImGuiWindow type
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Window";
    ini_handler.TypeHash = ImHash("Window", 0, 0);
    ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    ini_handler.ReadLineFn = SettingsHandlerWindow_ReadLine;
    ini_handler.WriteAllFn = SettingsHandlerWindow_WriteAll;
    g.SettingsHandlers.push_front(ini_handler);

    g.Initialized = true;
}